

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  Intersectors *pIVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  int iVar13;
  undefined4 uVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  long lVar16;
  RayHitK<4> *pRVar17;
  RayHitK<4> *pRVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  float *vertices;
  ulong uVar33;
  Scene *scene;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar62;
  float fVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  uint uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  uint uVar84;
  uint uVar85;
  uint uVar86;
  undefined1 auVar83 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2728) [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [16];
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined8 *local_26a0;
  ulong local_2698;
  ulong local_2690;
  ulong local_2688;
  ulong local_2680;
  Intersectors *local_2678;
  Scene *local_2670;
  RayHitK<4> *local_2668;
  undefined8 *local_2660;
  void *local_2658;
  RTCRayQueryContext *local_2650;
  RayHitK<4> *local_2648;
  undefined1 (*local_2640) [16];
  undefined4 local_2638;
  undefined8 local_2630;
  undefined8 uStack_2628;
  undefined1 local_2620 [32];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25d0 [16];
  float local_25c0 [4];
  float local_25b0 [4];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined4 local_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  ulong uVar18;
  
  local_2728 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar58 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_23c0._4_4_ = fVar58;
  local_23c0._0_4_ = fVar58;
  local_23c0._8_4_ = fVar58;
  local_23c0._12_4_ = fVar58;
  local_23c0._16_4_ = fVar58;
  local_23c0._20_4_ = fVar58;
  local_23c0._24_4_ = fVar58;
  local_23c0._28_4_ = fVar58;
  auVar70 = ZEXT3264(local_23c0);
  fVar62 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = fVar62;
  local_23e0._0_4_ = fVar62;
  local_23e0._8_4_ = fVar62;
  local_23e0._12_4_ = fVar62;
  local_23e0._16_4_ = fVar62;
  local_23e0._20_4_ = fVar62;
  local_23e0._24_4_ = fVar62;
  local_23e0._28_4_ = fVar62;
  auVar75 = ZEXT3264(local_23e0);
  fVar63 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = fVar63;
  local_2400._0_4_ = fVar63;
  local_2400._8_4_ = fVar63;
  local_2400._12_4_ = fVar63;
  local_2400._16_4_ = fVar63;
  local_2400._20_4_ = fVar63;
  local_2400._24_4_ = fVar63;
  local_2400._28_4_ = fVar63;
  auVar79 = ZEXT3264(local_2400);
  fVar58 = fVar58 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar62 = fVar62 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar63 = fVar63 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2680 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2688 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2690 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2698 = local_2680 ^ 0x20;
  uVar25 = local_2688 ^ 0x20;
  uVar29 = local_2690 ^ 0x20;
  iVar13 = (tray->tfar).field_0.i[k];
  auVar44 = ZEXT3264(CONCAT428(iVar13,CONCAT424(iVar13,CONCAT420(iVar13,CONCAT416(iVar13,CONCAT412(
                                                  iVar13,CONCAT48(iVar13,CONCAT44(iVar13,iVar13)))))
                                               )));
  local_2420._0_8_ = CONCAT44(fVar58,fVar58) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar58;
  local_2420._12_4_ = -fVar58;
  local_2420._16_4_ = -fVar58;
  local_2420._20_4_ = -fVar58;
  local_2420._24_4_ = -fVar58;
  local_2420._28_4_ = -fVar58;
  auVar83 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar62,fVar62) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar62;
  local_2440._12_4_ = -fVar62;
  local_2440._16_4_ = -fVar62;
  local_2440._20_4_ = -fVar62;
  local_2440._24_4_ = -fVar62;
  local_2440._28_4_ = -fVar62;
  auVar90 = ZEXT3264(local_2440);
  iVar13 = (tray->tnear).field_0.i[k];
  local_2460._4_4_ = iVar13;
  local_2460._0_4_ = iVar13;
  local_2460._8_4_ = iVar13;
  local_2460._12_4_ = iVar13;
  local_2460._16_4_ = iVar13;
  local_2460._20_4_ = iVar13;
  local_2460._24_4_ = iVar13;
  local_2460._28_4_ = iVar13;
  auVar92 = ZEXT3264(local_2460);
  local_2480._0_8_ = CONCAT44(fVar63,fVar63) ^ 0x8000000080000000;
  local_2480._8_4_ = -fVar63;
  local_2480._12_4_ = -fVar63;
  local_2480._16_4_ = -fVar63;
  local_2480._20_4_ = -fVar63;
  local_2480._24_4_ = -fVar63;
  local_2480._28_4_ = -fVar63;
  auVar96 = ZEXT3264(local_2480);
  local_26a0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  uVar18 = local_2680;
  uVar20 = local_2690;
  uVar21 = local_2698;
  uVar24 = local_2688;
  do {
    do {
      do {
        if (local_2728 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar12 = local_2728 + -1;
        local_2728 = local_2728 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar12 + 8));
      uVar35 = *(ulong *)*local_2728;
      do {
        auVar95 = auVar96._0_32_;
        auVar89 = auVar90._0_32_;
        auVar82 = auVar83._0_32_;
        auVar78 = auVar79._0_32_;
        auVar74 = auVar75._0_32_;
        auVar69 = auVar70._0_32_;
        if ((uVar35 & 8) == 0) {
          uVar14 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar57._4_4_ = uVar14;
          auVar57._0_4_ = uVar14;
          auVar57._8_4_ = uVar14;
          auVar57._12_4_ = uVar14;
          auVar57._16_4_ = uVar14;
          auVar57._20_4_ = uVar14;
          auVar57._24_4_ = uVar14;
          auVar57._28_4_ = uVar14;
          uVar15 = uVar35 & 0xfffffffffffffff0;
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar18),auVar57,
                                    *(undefined1 (*) [32])(uVar15 + 0x40 + uVar18));
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar24),auVar57,
                                    *(undefined1 (*) [32])(uVar15 + 0x40 + uVar24));
          auVar52 = vfmadd213ps_fma(ZEXT1632(auVar52),auVar69,auVar82);
          auVar53 = vfmadd213ps_fma(ZEXT1632(auVar53),auVar74,auVar89);
          auVar5 = vpmaxsd_avx2(ZEXT1632(auVar52),ZEXT1632(auVar53));
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar20),auVar57,
                                    *(undefined1 (*) [32])(uVar15 + 0x40 + uVar20));
          auVar52 = vfmadd213ps_fma(ZEXT1632(auVar52),auVar78,auVar95);
          auVar6 = vpmaxsd_avx2(ZEXT1632(auVar52),auVar92._0_32_);
          local_2620 = vpmaxsd_avx2(auVar5,auVar6);
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar21),auVar57,
                                    *(undefined1 (*) [32])(uVar15 + 0x40 + uVar21));
          auVar52 = vfmadd213ps_fma(ZEXT1632(auVar52),auVar69,auVar82);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar25),auVar57,
                                    *(undefined1 (*) [32])(uVar15 + 0x40 + uVar25));
          auVar53 = vfmadd213ps_fma(ZEXT1632(auVar53),auVar74,auVar89);
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar29),auVar57,
                                    *(undefined1 (*) [32])(uVar15 + 0x40 + uVar29));
          auVar5 = vpminsd_avx2(ZEXT1632(auVar52),ZEXT1632(auVar53));
          auVar52 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar78,auVar95);
          auVar6 = vpminsd_avx2(ZEXT1632(auVar52),auVar44._0_32_);
          auVar5 = vpminsd_avx2(auVar5,auVar6);
          auVar5 = vcmpps_avx(local_2620,auVar5,2);
          if (((uint)uVar35 & 7) == 6) {
            auVar6 = vcmpps_avx(*(undefined1 (*) [32])(uVar15 + 0x1c0),auVar57,2);
            auVar57 = vcmpps_avx(auVar57,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
            auVar6 = vandps_avx(auVar6,auVar57);
            auVar5 = vandps_avx(auVar6,auVar5);
            auVar52 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
          }
          else {
            auVar52 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
          }
          auVar52 = vpsllw_avx(auVar52,0xf);
          auVar52 = vpacksswb_avx(auVar52,auVar52);
          This = (Intersectors *)
                 (ulong)(byte)(SUB161(auVar52 >> 7,0) & 1 | (SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar52 >> 0x37,0) & 1) << 6 | SUB161(auVar52 >> 0x3f,0) << 7
                              );
        }
        if ((uVar35 & 8) == 0) {
          if (This == (Intersectors *)0x0) {
            iVar13 = 4;
          }
          else {
            uVar15 = uVar35 & 0xfffffffffffffff0;
            lVar22 = 0;
            for (pIVar7 = This; ((ulong)pIVar7 & 1) == 0;
                pIVar7 = (Intersectors *)((ulong)pIVar7 >> 1 | 0x8000000000000000)) {
              lVar22 = lVar22 + 1;
            }
            iVar13 = 0;
            uVar27 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
            uVar35 = *(ulong *)(uVar15 + lVar22 * 8);
            if (uVar27 != 0) {
              uVar80 = *(uint *)(local_2620 + lVar22 * 4);
              lVar22 = 0;
              for (uVar30 = uVar27; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                lVar22 = lVar22 + 1;
              }
              uVar27 = uVar27 - 1 & uVar27;
              uVar30 = *(ulong *)(uVar15 + lVar22 * 8);
              uVar84 = *(uint *)(local_2620 + lVar22 * 4);
              if (uVar27 == 0) {
                if (uVar80 < uVar84) {
                  *(ulong *)*local_2728 = uVar30;
                  *(uint *)(*local_2728 + 8) = uVar84;
                  local_2728 = local_2728 + 1;
                }
                else {
                  *(ulong *)*local_2728 = uVar35;
                  *(uint *)(*local_2728 + 8) = uVar80;
                  uVar35 = uVar30;
                  local_2728 = local_2728 + 1;
                }
              }
              else {
                auVar52._8_8_ = 0;
                auVar52._0_8_ = uVar35;
                auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar80));
                auVar53._8_8_ = 0;
                auVar53._0_8_ = uVar30;
                auVar53 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar84));
                lVar22 = 0;
                for (uVar35 = uVar27; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000)
                {
                  lVar22 = lVar22 + 1;
                }
                uVar27 = uVar27 - 1 & uVar27;
                auVar59._8_8_ = 0;
                auVar59._0_8_ = *(ulong *)(uVar15 + lVar22 * 8);
                auVar45 = vpunpcklqdq_avx(auVar59,ZEXT416(*(uint *)(local_2620 + lVar22 * 4)));
                auVar59 = vpcmpgtd_avx(auVar53,auVar52);
                if (uVar27 == 0) {
                  auVar67 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar53,auVar52,auVar67);
                  auVar52 = vblendvps_avx(auVar52,auVar53,auVar67);
                  auVar53 = vpcmpgtd_avx(auVar45,auVar59);
                  auVar67 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar45,auVar59,auVar67);
                  auVar59 = vblendvps_avx(auVar59,auVar45,auVar67);
                  auVar45 = vpcmpgtd_avx(auVar59,auVar52);
                  auVar67 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar59,auVar52,auVar67);
                  auVar52 = vblendvps_avx(auVar52,auVar59,auVar67);
                  *local_2728 = auVar52;
                  local_2728[1] = auVar45;
                  uVar35 = auVar53._0_8_;
                  local_2728 = local_2728 + 2;
                }
                else {
                  lVar22 = 0;
                  for (uVar35 = uVar27; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000
                      ) {
                    lVar22 = lVar22 + 1;
                  }
                  uVar27 = uVar27 - 1 & uVar27;
                  auVar67._8_8_ = 0;
                  auVar67._0_8_ = *(ulong *)(uVar15 + lVar22 * 8);
                  auVar67 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_2620 + lVar22 * 4)));
                  if (uVar27 == 0) {
                    auVar40 = vpshufd_avx(auVar59,0xaa);
                    auVar59 = vblendvps_avx(auVar53,auVar52,auVar40);
                    auVar52 = vblendvps_avx(auVar52,auVar53,auVar40);
                    auVar53 = vpcmpgtd_avx(auVar67,auVar45);
                    auVar40 = vpshufd_avx(auVar53,0xaa);
                    auVar53 = vblendvps_avx(auVar67,auVar45,auVar40);
                    auVar45 = vblendvps_avx(auVar45,auVar67,auVar40);
                    auVar67 = vpcmpgtd_avx(auVar45,auVar52);
                    auVar40 = vpshufd_avx(auVar67,0xaa);
                    auVar67 = vblendvps_avx(auVar45,auVar52,auVar40);
                    auVar52 = vblendvps_avx(auVar52,auVar45,auVar40);
                    auVar45 = vpcmpgtd_avx(auVar53,auVar59);
                    auVar40 = vpshufd_avx(auVar45,0xaa);
                    auVar45 = vblendvps_avx(auVar53,auVar59,auVar40);
                    auVar53 = vblendvps_avx(auVar59,auVar53,auVar40);
                    auVar59 = vpcmpgtd_avx(auVar67,auVar53);
                    auVar40 = vpshufd_avx(auVar59,0xaa);
                    auVar59 = vblendvps_avx(auVar67,auVar53,auVar40);
                    auVar53 = vblendvps_avx(auVar53,auVar67,auVar40);
                    *local_2728 = auVar52;
                    local_2728[1] = auVar53;
                    local_2728[2] = auVar59;
                    uVar35 = auVar45._0_8_;
                    local_2728 = local_2728 + 3;
                  }
                  else {
                    *local_2728 = auVar52;
                    local_2728[1] = auVar53;
                    local_2728[2] = auVar45;
                    local_2728[3] = auVar67;
                    lVar22 = 0x30;
                    do {
                      lVar23 = lVar22;
                      lVar22 = 0;
                      for (uVar35 = uVar27; (uVar35 & 1) == 0;
                          uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                        lVar22 = lVar22 + 1;
                      }
                      auVar45._8_8_ = 0;
                      auVar45._0_8_ = *(ulong *)(uVar15 + lVar22 * 8);
                      auVar52 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_2620 + lVar22 * 4)))
                      ;
                      *(undefined1 (*) [16])(local_2728[1] + lVar23) = auVar52;
                      uVar27 = uVar27 - 1 & uVar27;
                      lVar22 = lVar23 + 0x10;
                    } while (uVar27 != 0);
                    pauVar12 = (undefined1 (*) [16])(local_2728[1] + lVar23);
                    if (lVar23 + 0x10 != 0) {
                      lVar22 = 0x10;
                      pauVar26 = local_2728;
                      do {
                        uVar8 = *(undefined8 *)pauVar26[1];
                        uVar9 = *(undefined8 *)(pauVar26[1] + 8);
                        uVar80 = *(uint *)(pauVar26[1] + 8);
                        pauVar26 = pauVar26 + 1;
                        lVar23 = lVar22;
                        do {
                          if (uVar80 <= *(uint *)(local_2728[-1] + lVar23 + 8)) {
                            pauVar28 = (undefined1 (*) [16])(*local_2728 + lVar23);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_2728 + lVar23) =
                               *(undefined1 (*) [16])(local_2728[-1] + lVar23);
                          lVar23 = lVar23 + -0x10;
                          pauVar28 = local_2728;
                        } while (lVar23 != 0);
                        *(undefined8 *)*pauVar28 = uVar8;
                        *(undefined8 *)(*pauVar28 + 8) = uVar9;
                        lVar22 = lVar22 + 0x10;
                      } while (pauVar12 != pauVar26);
                    }
                    uVar35 = *(ulong *)*pauVar12;
                    local_2728 = pauVar12;
                  }
                  auVar70 = ZEXT3264(auVar69);
                  auVar75 = ZEXT3264(auVar74);
                  auVar79 = ZEXT3264(auVar78);
                  auVar83 = ZEXT3264(auVar82);
                  auVar90 = ZEXT3264(auVar89);
                  auVar92 = ZEXT3264(auVar92._0_32_);
                  auVar96 = ZEXT3264(auVar95);
                }
              }
            }
          }
        }
        else {
          iVar13 = 6;
        }
      } while (iVar13 == 0);
    } while (iVar13 != 6);
    local_2668 = (RayHitK<4> *)((ulong)((uint)uVar35 & 0xf) - 8);
    local_2678 = This;
    if (local_2668 != (RayHitK<4> *)0x0) {
      uVar35 = uVar35 & 0xfffffffffffffff0;
      pRVar17 = (RayHitK<4> *)0x0;
      do {
        lVar16 = (long)pRVar17 * 0x50;
        pSVar3 = context->scene;
        pGVar4 = (pSVar3->geometries).items[*(uint *)(uVar35 + 0x30 + lVar16)].ptr;
        fVar58 = (pGVar4->time_range).lower;
        fVar58 = pGVar4->fnumTimeSegments *
                 ((*(float *)(ray + k * 4 + 0x70) - fVar58) / ((pGVar4->time_range).upper - fVar58))
        ;
        auVar52 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),9);
        auVar52 = vminss_avx(auVar52,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
        auVar46 = vmaxss_avx(ZEXT816(0),auVar52);
        lVar23 = (long)(int)auVar46._0_4_ * 0x38;
        uVar15 = (ulong)*(uint *)(uVar35 + 4 + lVar16);
        lVar22 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar23);
        lVar23 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar23);
        auVar52 = *(undefined1 (*) [16])(lVar22 + (ulong)*(uint *)(uVar35 + lVar16) * 4);
        uVar24 = (ulong)*(uint *)(uVar35 + 0x10 + lVar16);
        auVar53 = *(undefined1 (*) [16])(lVar22 + uVar24 * 4);
        uVar18 = (ulong)*(uint *)(uVar35 + 0x20 + lVar16);
        auVar55 = *(undefined1 (*) [16])(lVar22 + uVar18 * 4);
        auVar59 = *(undefined1 (*) [16])(lVar22 + uVar15 * 4);
        uVar27 = (ulong)*(uint *)(uVar35 + 0x14 + lVar16);
        auVar45 = *(undefined1 (*) [16])(lVar22 + uVar27 * 4);
        uVar20 = (ulong)*(uint *)(uVar35 + 0x24 + lVar16);
        auVar60 = *(undefined1 (*) [16])(lVar22 + uVar20 * 4);
        uVar33 = (ulong)*(uint *)(uVar35 + 8 + lVar16);
        auVar67 = *(undefined1 (*) [16])(lVar22 + uVar33 * 4);
        uVar21 = (ulong)*(uint *)(uVar35 + 0x18 + lVar16);
        auVar40 = *(undefined1 (*) [16])(lVar22 + uVar21 * 4);
        uVar30 = (ulong)*(uint *)(uVar35 + 0x28 + lVar16);
        auVar36 = *(undefined1 (*) [16])(lVar22 + uVar30 * 4);
        uVar34 = (ulong)*(uint *)(uVar35 + 0xc + lVar16);
        auVar42 = *(undefined1 (*) [16])(lVar22 + uVar34 * 4);
        uVar32 = (ulong)*(uint *)(uVar35 + 0x1c + lVar16);
        auVar37 = *(undefined1 (*) [16])(lVar22 + uVar32 * 4);
        uVar31 = (ulong)*(uint *)(uVar35 + 0x2c + lVar16);
        auVar38 = *(undefined1 (*) [16])(lVar22 + uVar31 * 4);
        auVar39 = *(undefined1 (*) [16])(lVar23 + (ulong)*(uint *)(uVar35 + lVar16) * 4);
        auVar47 = *(undefined1 (*) [16])(lVar23 + uVar24 * 4);
        fVar58 = fVar58 - auVar46._0_4_;
        auVar46 = vunpcklps_avx(auVar52,auVar67);
        auVar67 = vunpckhps_avx(auVar52,auVar67);
        auVar54 = vunpcklps_avx(auVar59,auVar42);
        auVar59 = vunpckhps_avx(auVar59,auVar42);
        auVar52 = *(undefined1 (*) [16])(lVar23 + uVar15 * 4);
        local_2550 = vunpcklps_avx(auVar67,auVar59);
        auVar42 = vunpcklps_avx(auVar46,auVar54);
        auVar67 = vunpckhps_avx(auVar46,auVar54);
        auVar46 = vunpcklps_avx(auVar53,auVar40);
        auVar59 = vunpckhps_avx(auVar53,auVar40);
        auVar40 = vunpcklps_avx(auVar45,auVar37);
        auVar45 = vunpckhps_avx(auVar45,auVar37);
        auVar53 = *(undefined1 (*) [16])(lVar23 + uVar33 * 4);
        local_2540 = vunpcklps_avx(auVar59,auVar45);
        auVar37 = vunpcklps_avx(auVar46,auVar40);
        local_2560 = vunpckhps_avx(auVar46,auVar40);
        auVar46 = vunpcklps_avx(auVar55,auVar36);
        auVar45 = vunpckhps_avx(auVar55,auVar36);
        auVar36 = vunpcklps_avx(auVar60,auVar38);
        auVar40 = vunpckhps_avx(auVar60,auVar38);
        auVar59 = *(undefined1 (*) [16])(lVar23 + uVar34 * 4);
        local_26c0 = vunpcklps_avx(auVar45,auVar40);
        local_26d0 = vunpcklps_avx(auVar46,auVar36);
        local_2530 = vunpckhps_avx(auVar46,auVar36);
        auVar45 = vunpcklps_avx(auVar39,auVar53);
        auVar53 = vunpckhps_avx(auVar39,auVar53);
        auVar40 = vunpcklps_avx(auVar52,auVar59);
        auVar59 = vunpckhps_avx(auVar52,auVar59);
        auVar52 = *(undefined1 (*) [16])(lVar23 + uVar21 * 4);
        auVar36 = vunpcklps_avx(auVar53,auVar59);
        auVar38 = vunpcklps_avx(auVar45,auVar40);
        auVar59 = vunpckhps_avx(auVar45,auVar40);
        auVar40 = vunpcklps_avx(auVar47,auVar52);
        auVar45 = vunpckhps_avx(auVar47,auVar52);
        auVar52 = *(undefined1 (*) [16])(lVar23 + uVar27 * 4);
        auVar53 = *(undefined1 (*) [16])(lVar23 + uVar32 * 4);
        auVar39 = vunpcklps_avx(auVar52,auVar53);
        auVar52 = vunpckhps_avx(auVar52,auVar53);
        auVar47 = vunpcklps_avx(auVar45,auVar52);
        auVar46 = vunpcklps_avx(auVar40,auVar39);
        auVar45 = vunpckhps_avx(auVar40,auVar39);
        auVar52 = *(undefined1 (*) [16])(lVar23 + uVar18 * 4);
        auVar53 = *(undefined1 (*) [16])(lVar23 + uVar30 * 4);
        auVar39 = vunpcklps_avx(auVar52,auVar53);
        auVar40 = vunpckhps_avx(auVar52,auVar53);
        auVar52 = *(undefined1 (*) [16])(lVar23 + uVar20 * 4);
        auVar53 = *(undefined1 (*) [16])(lVar23 + uVar31 * 4);
        auVar54 = vunpcklps_avx(auVar52,auVar53);
        auVar52 = vunpckhps_avx(auVar52,auVar53);
        auVar53 = vunpcklps_avx(auVar40,auVar52);
        auVar40 = vunpcklps_avx(auVar39,auVar54);
        auVar52 = vunpckhps_avx(auVar39,auVar54);
        fVar62 = 1.0 - fVar58;
        auVar93._4_4_ = fVar62;
        auVar93._0_4_ = fVar62;
        auVar93._8_4_ = fVar62;
        auVar93._12_4_ = fVar62;
        auVar68._0_4_ = fVar58 * auVar38._0_4_;
        auVar68._4_4_ = fVar58 * auVar38._4_4_;
        auVar68._8_4_ = fVar58 * auVar38._8_4_;
        auVar68._12_4_ = fVar58 * auVar38._12_4_;
        auVar42 = vfmadd231ps_fma(auVar68,auVar93,auVar42);
        auVar71._0_4_ = fVar58 * auVar59._0_4_;
        auVar71._4_4_ = fVar58 * auVar59._4_4_;
        auVar71._8_4_ = fVar58 * auVar59._8_4_;
        auVar71._12_4_ = fVar58 * auVar59._12_4_;
        auVar38 = vfmadd231ps_fma(auVar71,auVar93,auVar67);
        auVar76._0_4_ = fVar58 * auVar36._0_4_;
        auVar76._4_4_ = fVar58 * auVar36._4_4_;
        auVar76._8_4_ = fVar58 * auVar36._8_4_;
        auVar76._12_4_ = fVar58 * auVar36._12_4_;
        auVar39 = vfmadd231ps_fma(auVar76,auVar93,local_2550);
        auVar36._0_4_ = fVar58 * auVar46._0_4_;
        auVar36._4_4_ = fVar58 * auVar46._4_4_;
        auVar36._8_4_ = fVar58 * auVar46._8_4_;
        auVar36._12_4_ = fVar58 * auVar46._12_4_;
        auVar59 = vfmadd231ps_fma(auVar36,auVar93,auVar37);
        auVar46._0_4_ = fVar58 * auVar45._0_4_;
        auVar46._4_4_ = fVar58 * auVar45._4_4_;
        auVar46._8_4_ = fVar58 * auVar45._8_4_;
        auVar46._12_4_ = fVar58 * auVar45._12_4_;
        auVar45 = vfmadd231ps_fma(auVar46,auVar93,local_2560);
        auVar54._0_4_ = fVar58 * auVar47._0_4_;
        auVar54._4_4_ = fVar58 * auVar47._4_4_;
        auVar54._8_4_ = fVar58 * auVar47._8_4_;
        auVar54._12_4_ = fVar58 * auVar47._12_4_;
        auVar67 = vfmadd231ps_fma(auVar54,auVar93,local_2540);
        puVar1 = (undefined8 *)(uVar35 + 0x30 + lVar16);
        local_2520 = *puVar1;
        uStack_2518 = puVar1[1];
        puVar1 = (undefined8 *)(uVar35 + 0x40 + lVar16);
        auVar65._0_4_ = fVar58 * auVar40._0_4_;
        auVar65._4_4_ = fVar58 * auVar40._4_4_;
        auVar65._8_4_ = fVar58 * auVar40._8_4_;
        auVar65._12_4_ = fVar58 * auVar40._12_4_;
        auVar87._0_4_ = fVar58 * auVar52._0_4_;
        auVar87._4_4_ = fVar58 * auVar52._4_4_;
        auVar87._8_4_ = fVar58 * auVar52._8_4_;
        auVar87._12_4_ = fVar58 * auVar52._12_4_;
        auVar97._0_4_ = fVar58 * auVar53._0_4_;
        auVar97._4_4_ = fVar58 * auVar53._4_4_;
        auVar97._8_4_ = fVar58 * auVar53._8_4_;
        auVar97._12_4_ = fVar58 * auVar53._12_4_;
        auVar40 = vfmadd231ps_fma(auVar65,auVar93,local_26d0);
        auVar36 = vfmadd231ps_fma(auVar87,auVar93,local_2530);
        auVar37 = vfmadd231ps_fma(auVar97,auVar93,local_26c0);
        local_2630 = *puVar1;
        uStack_2628 = puVar1[1];
        auVar53 = vsubps_avx(auVar42,auVar59);
        auVar52 = vsubps_avx(auVar38,auVar45);
        auVar59 = vsubps_avx(auVar39,auVar67);
        auVar45 = vsubps_avx(auVar40,auVar42);
        auVar67 = vsubps_avx(auVar36,auVar38);
        auVar40 = vsubps_avx(auVar37,auVar39);
        auVar47._0_4_ = auVar52._0_4_ * auVar40._0_4_;
        auVar47._4_4_ = auVar52._4_4_ * auVar40._4_4_;
        auVar47._8_4_ = auVar52._8_4_ * auVar40._8_4_;
        auVar47._12_4_ = auVar52._12_4_ * auVar40._12_4_;
        local_2590 = vfmsub231ps_fma(auVar47,auVar67,auVar59);
        auVar60._0_4_ = auVar59._0_4_ * auVar45._0_4_;
        auVar60._4_4_ = auVar59._4_4_ * auVar45._4_4_;
        auVar60._8_4_ = auVar59._8_4_ * auVar45._8_4_;
        auVar60._12_4_ = auVar59._12_4_ * auVar45._12_4_;
        local_2580 = vfmsub231ps_fma(auVar60,auVar40,auVar53);
        uVar14 = *(undefined4 *)(ray + k * 4);
        auVar55._4_4_ = uVar14;
        auVar55._0_4_ = uVar14;
        auVar55._8_4_ = uVar14;
        auVar55._12_4_ = uVar14;
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar66._4_4_ = uVar14;
        auVar66._0_4_ = uVar14;
        auVar66._8_4_ = uVar14;
        auVar66._12_4_ = uVar14;
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar37._4_4_ = uVar14;
        auVar37._0_4_ = uVar14;
        auVar37._8_4_ = uVar14;
        auVar37._12_4_ = uVar14;
        fVar58 = *(float *)(ray + k * 4 + 0x40);
        auVar94._4_4_ = fVar58;
        auVar94._0_4_ = fVar58;
        auVar94._8_4_ = fVar58;
        auVar94._12_4_ = fVar58;
        auVar36 = vsubps_avx(auVar42,auVar55);
        fVar62 = *(float *)(ray + k * 4 + 0x50);
        auVar98._4_4_ = fVar62;
        auVar98._0_4_ = fVar62;
        auVar98._8_4_ = fVar62;
        auVar98._12_4_ = fVar62;
        auVar42 = vsubps_avx(auVar38,auVar66);
        fVar63 = *(float *)(ray + k * 4 + 0x60);
        auVar99._4_4_ = fVar63;
        auVar99._0_4_ = fVar63;
        auVar99._8_4_ = fVar63;
        auVar99._12_4_ = fVar63;
        auVar37 = vsubps_avx(auVar39,auVar37);
        auVar38._0_4_ = fVar58 * auVar42._0_4_;
        auVar38._4_4_ = fVar58 * auVar42._4_4_;
        auVar38._8_4_ = fVar58 * auVar42._8_4_;
        auVar38._12_4_ = fVar58 * auVar42._12_4_;
        auVar38 = vfmsub231ps_fma(auVar38,auVar36,auVar98);
        auVar77._0_4_ = auVar40._0_4_ * auVar38._0_4_;
        auVar77._4_4_ = auVar40._4_4_ * auVar38._4_4_;
        auVar77._8_4_ = auVar40._8_4_ * auVar38._8_4_;
        auVar77._12_4_ = auVar40._12_4_ * auVar38._12_4_;
        auVar39._0_4_ = auVar59._0_4_ * auVar38._0_4_;
        auVar39._4_4_ = auVar59._4_4_ * auVar38._4_4_;
        auVar39._8_4_ = auVar59._8_4_ * auVar38._8_4_;
        auVar39._12_4_ = auVar59._12_4_ * auVar38._12_4_;
        auVar72._0_4_ = fVar63 * auVar36._0_4_;
        auVar72._4_4_ = fVar63 * auVar36._4_4_;
        auVar72._8_4_ = fVar63 * auVar36._8_4_;
        auVar72._12_4_ = fVar63 * auVar36._12_4_;
        auVar40 = vfmsub231ps_fma(auVar72,auVar37,auVar94);
        auVar59 = vfmadd231ps_fma(auVar77,auVar40,auVar67);
        auVar40 = vfmadd231ps_fma(auVar39,auVar52,auVar40);
        auVar73._0_4_ = auVar67._0_4_ * auVar53._0_4_;
        auVar73._4_4_ = auVar67._4_4_ * auVar53._4_4_;
        auVar73._8_4_ = auVar67._8_4_ * auVar53._8_4_;
        auVar73._12_4_ = auVar67._12_4_ * auVar53._12_4_;
        local_2570 = vfmsub231ps_fma(auVar73,auVar45,auVar52);
        auVar88._0_4_ = fVar62 * auVar37._0_4_;
        auVar88._4_4_ = fVar62 * auVar37._4_4_;
        auVar88._8_4_ = fVar62 * auVar37._8_4_;
        auVar88._12_4_ = fVar62 * auVar37._12_4_;
        auVar38 = vfmsub231ps_fma(auVar88,auVar42,auVar99);
        auVar91._0_4_ = fVar63 * local_2570._0_4_;
        auVar91._4_4_ = fVar63 * local_2570._4_4_;
        auVar91._8_4_ = fVar63 * local_2570._8_4_;
        auVar91._12_4_ = fVar63 * local_2570._12_4_;
        auVar52 = vfmadd231ps_fma(auVar91,local_2580,auVar98);
        auVar67 = vfmadd231ps_fma(auVar52,local_2590,auVar94);
        auVar81._8_4_ = 0x80000000;
        auVar81._0_8_ = 0x8000000080000000;
        auVar81._12_4_ = 0x80000000;
        auVar59 = vfmadd231ps_fma(auVar59,auVar38,auVar45);
        auVar52 = vandps_avx(auVar67,auVar81);
        uVar80 = auVar52._0_4_;
        local_2620._0_4_ = (float)(uVar80 ^ auVar59._0_4_);
        uVar84 = auVar52._4_4_;
        local_2620._4_4_ = (float)(uVar84 ^ auVar59._4_4_);
        uVar85 = auVar52._8_4_;
        local_2620._8_4_ = (float)(uVar85 ^ auVar59._8_4_);
        uVar86 = auVar52._12_4_;
        local_2620._12_4_ = (float)(uVar86 ^ auVar59._12_4_);
        auVar52 = vfmadd231ps_fma(auVar40,auVar53,auVar38);
        local_2620._16_4_ = (float)(uVar80 ^ auVar52._0_4_);
        local_2620._20_4_ = (float)(uVar84 ^ auVar52._4_4_);
        local_2620._24_4_ = (float)(uVar85 ^ auVar52._8_4_);
        local_2620._28_4_ = (float)(uVar86 ^ auVar52._12_4_);
        auVar59 = ZEXT816(0) << 0x20;
        auVar52 = vcmpps_avx(local_2620._0_16_,auVar59,5);
        auVar53 = vcmpps_avx(local_2620._16_16_,auVar59,5);
        auVar52 = vandps_avx(auVar52,auVar53);
        auVar61._8_4_ = 0x7fffffff;
        auVar61._0_8_ = 0x7fffffff7fffffff;
        auVar61._12_4_ = 0x7fffffff;
        local_25f0 = vandps_avx(auVar67,auVar61);
        auVar53 = vcmpps_avx(auVar67,auVar59,4);
        auVar52 = vandps_avx(auVar53,auVar52);
        auVar40._0_4_ = local_2620._16_4_ + local_2620._0_4_;
        auVar40._4_4_ = local_2620._20_4_ + local_2620._4_4_;
        auVar40._8_4_ = local_2620._24_4_ + local_2620._8_4_;
        auVar40._12_4_ = local_2620._28_4_ + local_2620._12_4_;
        auVar53 = vcmpps_avx(auVar40,local_25f0,2);
        auVar59 = auVar53 & auVar52;
        if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar59[0xf] < '\0') {
          auVar52 = vandps_avx(auVar52,auVar53);
          auVar41._0_4_ = local_2570._0_4_ * auVar37._0_4_;
          auVar41._4_4_ = local_2570._4_4_ * auVar37._4_4_;
          auVar41._8_4_ = local_2570._8_4_ * auVar37._8_4_;
          auVar41._12_4_ = local_2570._12_4_ * auVar37._12_4_;
          auVar53 = vfmadd213ps_fma(auVar42,local_2580,auVar41);
          auVar53 = vfmadd213ps_fma(auVar36,local_2590,auVar53);
          local_2600._0_4_ = (float)(uVar80 ^ auVar53._0_4_);
          local_2600._4_4_ = (float)(uVar84 ^ auVar53._4_4_);
          local_2600._8_4_ = (float)(uVar85 ^ auVar53._8_4_);
          local_2600._12_4_ = (float)(uVar86 ^ auVar53._12_4_);
          fVar58 = *(float *)(ray + k * 4 + 0x30);
          auVar42._0_4_ = local_25f0._0_4_ * fVar58;
          auVar42._4_4_ = local_25f0._4_4_ * fVar58;
          auVar42._8_4_ = local_25f0._8_4_ * fVar58;
          auVar42._12_4_ = local_25f0._12_4_ * fVar58;
          auVar53 = vcmpps_avx(auVar42,local_2600,1);
          fVar58 = *(float *)(ray + k * 4 + 0x80);
          auVar56._0_4_ = local_25f0._0_4_ * fVar58;
          auVar56._4_4_ = local_25f0._4_4_ * fVar58;
          auVar56._8_4_ = local_25f0._8_4_ * fVar58;
          auVar56._12_4_ = local_25f0._12_4_ * fVar58;
          auVar59 = vcmpps_avx(local_2600,auVar56,2);
          auVar53 = vandps_avx(auVar53,auVar59);
          auVar59 = auVar52 & auVar53;
          if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar59[0xf] < '\0') {
            local_26e0 = vandps_avx(auVar52,auVar53);
            local_25d0 = local_26e0;
            auVar52 = vrcpps_avx(local_25f0);
            auVar48._8_4_ = 0x3f800000;
            auVar48._0_8_ = &DAT_3f8000003f800000;
            auVar48._12_4_ = 0x3f800000;
            auVar53 = vfnmadd213ps_fma(local_25f0,auVar52,auVar48);
            auVar52 = vfmadd132ps_fma(auVar53,auVar52,auVar52);
            fVar58 = auVar52._0_4_;
            local_25a0._0_4_ = fVar58 * local_2600._0_4_;
            fVar62 = auVar52._4_4_;
            local_25a0._4_4_ = fVar62 * local_2600._4_4_;
            fVar63 = auVar52._8_4_;
            local_25a0._8_4_ = fVar63 * local_2600._8_4_;
            fVar64 = auVar52._12_4_;
            local_25a0._12_4_ = fVar64 * local_2600._12_4_;
            auVar44 = ZEXT1664(local_25a0);
            local_25c0[0] = fVar58 * local_2620._0_4_;
            local_25c0[1] = fVar62 * local_2620._4_4_;
            local_25c0[2] = fVar63 * local_2620._8_4_;
            local_25c0[3] = fVar64 * local_2620._12_4_;
            auVar49._8_4_ = 0x7f800000;
            auVar49._0_8_ = 0x7f8000007f800000;
            auVar49._12_4_ = 0x7f800000;
            auVar52 = vblendvps_avx(auVar49,local_25a0,local_26e0);
            local_25b0[0] = fVar58 * local_2620._16_4_;
            local_25b0[1] = fVar62 * local_2620._20_4_;
            local_25b0[2] = fVar63 * local_2620._24_4_;
            local_25b0[3] = fVar64 * local_2620._28_4_;
            auVar53 = vshufps_avx(auVar52,auVar52,0xb1);
            auVar53 = vminps_avx(auVar53,auVar52);
            auVar59 = vshufpd_avx(auVar53,auVar53,1);
            auVar53 = vminps_avx(auVar59,auVar53);
            auVar53 = vcmpps_avx(auVar52,auVar53,0);
            auVar59 = local_26e0 & auVar53;
            auVar52 = vpcmpeqd_avx(auVar52,auVar52);
            if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar59[0xf] < '\0') {
              auVar52 = auVar53;
            }
            auVar52 = vandps_avx(local_26e0,auVar52);
            pRVar19 = pRVar17;
            local_2670 = pSVar3;
            do {
              auVar52 = vpslld_avx(auVar52,0x1f);
              uVar14 = vmovmskps_avx(auVar52);
              lVar22 = 0;
              for (uVar18 = CONCAT44((int)((ulong)pRVar19 >> 0x20),uVar14); (uVar18 & 1) == 0;
                  uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                lVar22 = lVar22 + 1;
              }
              uVar80 = *(uint *)((long)&local_2520 + lVar22 * 4);
              pRVar19 = (RayHitK<4> *)(ulong)uVar80;
              pGVar4 = (pSVar3->geometries).items[(long)pRVar19].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_26e0 + lVar22 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar18 = (ulong)(uint)((int)lVar22 << 2);
                  uVar14 = *(undefined4 *)((long)local_25c0 + uVar18);
                  uVar2 = *(undefined4 *)((long)local_25b0 + uVar18);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar18);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2590 + uVar18);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2580 + uVar18);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2570 + uVar18);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar14;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2630 + uVar18)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar80;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                auVar52 = auVar44._0_16_;
                uVar18 = (ulong)(uint)((int)lVar22 * 4);
                uVar14 = *(undefined4 *)((long)local_25c0 + uVar18);
                local_24e0._4_4_ = uVar14;
                local_24e0._0_4_ = uVar14;
                local_24e0._8_4_ = uVar14;
                local_24e0._12_4_ = uVar14;
                local_24d0 = *(undefined4 *)((long)local_25b0 + uVar18);
                local_24b0._4_4_ = uVar80;
                local_24b0._0_4_ = uVar80;
                local_24b0._8_4_ = uVar80;
                local_24b0._12_4_ = uVar80;
                local_24c0 = *(undefined4 *)((long)&local_2630 + uVar18);
                local_2510._0_4_ = *(undefined4 *)(local_2590 + uVar18);
                uVar14 = *(undefined4 *)(local_2580 + uVar18);
                local_2500._4_4_ = uVar14;
                local_2500._0_4_ = uVar14;
                local_2500._8_4_ = uVar14;
                local_2500._12_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_2570 + uVar18);
                local_24f0._4_4_ = uVar14;
                local_24f0._0_4_ = uVar14;
                local_24f0._8_4_ = uVar14;
                local_24f0._12_4_ = uVar14;
                local_2510._4_4_ = local_2510._0_4_;
                local_2510._8_4_ = local_2510._0_4_;
                local_2510._12_4_ = local_2510._0_4_;
                uStack_24cc = local_24d0;
                uStack_24c8 = local_24d0;
                uStack_24c4 = local_24d0;
                uStack_24bc = local_24c0;
                uStack_24b8 = local_24c0;
                uStack_24b4 = local_24c0;
                vpcmpeqd_avx2(ZEXT1632(local_24e0),ZEXT1632(local_24e0));
                uStack_249c = context->user->instID[0];
                local_24a0 = uStack_249c;
                uStack_2498 = uStack_249c;
                uStack_2494 = uStack_249c;
                uStack_2490 = context->user->instPrimID[0];
                uStack_248c = uStack_2490;
                uStack_2488 = uStack_2490;
                uStack_2484 = uStack_2490;
                uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar18);
                local_26b0 = *local_26a0;
                uStack_26a8 = local_26a0[1];
                local_2660 = &local_26b0;
                local_2658 = pGVar4->userPtr;
                local_2650 = context->user;
                local_2640 = &local_2510;
                local_2638 = 4;
                pRVar19 = (RayHitK<4> *)pGVar4->intersectionFilterN;
                local_2648 = ray;
                if (pRVar19 != (RayHitK<4> *)0x0) {
                  pRVar19 = (RayHitK<4> *)(*(code *)pRVar19)(&local_2660);
                }
                auVar10._8_8_ = uStack_26a8;
                auVar10._0_8_ = local_26b0;
                if (auVar10 == (undefined1  [16])0x0) {
                  auVar53 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar53 = auVar53 ^ _DAT_01febe20;
                }
                else {
                  pRVar19 = (RayHitK<4> *)context->args->filter;
                  if ((pRVar19 != (RayHitK<4> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    pRVar19 = (RayHitK<4> *)(*(code *)pRVar19)(&local_2660);
                  }
                  auVar11._8_8_ = uStack_26a8;
                  auVar11._0_8_ = local_26b0;
                  auVar59 = vpcmpeqd_avx(auVar11,_DAT_01feba10);
                  auVar53 = auVar59 ^ _DAT_01febe20;
                  if (auVar11 != (undefined1  [16])0x0) {
                    auVar59 = auVar59 ^ _DAT_01febe20;
                    auVar45 = vmaskmovps_avx(auVar59,*local_2640);
                    *(undefined1 (*) [16])(local_2648 + 0xc0) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar59,local_2640[1]);
                    *(undefined1 (*) [16])(local_2648 + 0xd0) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar59,local_2640[2]);
                    *(undefined1 (*) [16])(local_2648 + 0xe0) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar59,local_2640[3]);
                    *(undefined1 (*) [16])(local_2648 + 0xf0) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar59,local_2640[4]);
                    *(undefined1 (*) [16])(local_2648 + 0x100) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar59,local_2640[5]);
                    *(undefined1 (*) [16])(local_2648 + 0x110) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar59,local_2640[6]);
                    *(undefined1 (*) [16])(local_2648 + 0x120) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar59,local_2640[7]);
                    *(undefined1 (*) [16])(local_2648 + 0x130) = auVar45;
                    auVar59 = vmaskmovps_avx(auVar59,local_2640[8]);
                    *(undefined1 (*) [16])(local_2648 + 0x140) = auVar59;
                    pRVar19 = local_2648;
                  }
                }
                auVar51._8_8_ = 0x100000001;
                auVar51._0_8_ = 0x100000001;
                if ((auVar51 & auVar53) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar14;
                  pRVar19 = ray;
                }
                *(undefined4 *)(local_26e0 + lVar22 * 4) = 0;
                uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar43._4_4_ = uVar14;
                auVar43._0_4_ = uVar14;
                auVar43._8_4_ = uVar14;
                auVar43._12_4_ = uVar14;
                auVar44 = ZEXT1664(auVar52);
                auVar52 = vcmpps_avx(auVar52,auVar43,2);
                local_26e0 = vandps_avx(auVar52,local_26e0);
              }
              if ((((local_26e0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_26e0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_26e0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_26e0[0xf]) break;
              auVar50._8_4_ = 0x7f800000;
              auVar50._0_8_ = 0x7f8000007f800000;
              auVar50._12_4_ = 0x7f800000;
              auVar52 = vblendvps_avx(auVar50,auVar44._0_16_,local_26e0);
              auVar53 = vshufps_avx(auVar52,auVar52,0xb1);
              auVar53 = vminps_avx(auVar53,auVar52);
              auVar59 = vshufpd_avx(auVar53,auVar53,1);
              auVar53 = vminps_avx(auVar59,auVar53);
              auVar53 = vcmpps_avx(auVar52,auVar53,0);
              auVar59 = local_26e0 & auVar53;
              auVar52 = local_26e0;
              if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar59[0xf] < '\0') {
                auVar52 = vandps_avx(auVar53,local_26e0);
              }
              auVar52 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar52);
            } while( true );
          }
        }
        pRVar17 = pRVar17 + 1;
      } while (pRVar17 != local_2668);
    }
    uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar44 = ZEXT3264(CONCAT428(uVar14,CONCAT424(uVar14,CONCAT420(uVar14,CONCAT416(uVar14,CONCAT412
                                                  (uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))))
                                                  ))));
    auVar70 = ZEXT3264(local_23c0);
    auVar75 = ZEXT3264(local_23e0);
    auVar79 = ZEXT3264(local_2400);
    auVar83 = ZEXT3264(local_2420);
    auVar90 = ZEXT3264(local_2440);
    auVar92 = ZEXT3264(local_2460);
    auVar96 = ZEXT3264(local_2480);
    This = local_2678;
    uVar18 = local_2680;
    uVar20 = local_2690;
    uVar21 = local_2698;
    uVar24 = local_2688;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }